

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

void mana_damageu(int n,monst *mtmp,char *k_name,int k_format,boolean missile)

{
  boolean bVar1;
  int iVar2;
  boolean missile_local;
  int k_format_local;
  char *k_name_local;
  monst *mtmp_local;
  int n_local;
  
  if (u.uprops[0x37].intrinsic == 0) {
    if ((u.uprops[0x2c].extrinsic != 0) ||
       ((mtmp_local._4_4_ = n, u.umonnum != u.umonster &&
        (bVar1 = resists_magm(&youmonst), bVar1 != '\0')))) {
      if (missile == '\0') {
        pline("You are unharmed!");
      }
      else {
        pline("The missiles bounce off!");
      }
      ugolemeffects(1,n);
      mtmp_local._4_4_ = 0;
    }
  }
  else {
    pline("You are unharmed!");
    mtmp_local._4_4_ = 0;
  }
  if (mtmp_local._4_4_ != 0) {
    if (mtmp == (monst *)0x0) {
      losehp(mtmp_local._4_4_,k_name,k_format);
      if (missile == '\0') {
        pline("Your body absorbs some of the magical energy!");
        iVar2 = rnd(mtmp_local._4_4_);
        u.uen = iVar2 + u.uenmax;
        u.uenmax = u.uen;
      }
      else {
        exercise(0,'\0');
      }
    }
    else {
      mdamageu(mtmp,mtmp_local._4_4_);
    }
  }
  return;
}

Assistant:

void mana_damageu(int n, struct monst *mtmp, const char *k_name, int k_format,
		  boolean missile)
{
	if (Invulnerable) {
	    pline("You are unharmed!");
	    n = 0;
	} else {
	    if (Antimagic) {
		if (missile)
		    pline("The missiles bounce off!");
		else
		    pline("You are unharmed!");
		ugolemeffects(AD_MAGM, n);
		n = 0;
	    }
	}

	if (n) {
	    if (mtmp) {
		mdamageu(mtmp, n);
	    } else {
		losehp(n, k_name, k_format);
		if (!missile) {
		    pline("Your body absorbs some of the magical energy!");
		    u.uen = (u.uenmax += rnd(n));
		} else {
		    exercise(A_STR, FALSE);
		}
	    }
	}
}